

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O1

cmServerResponse * __thiscall
cmServerProtocol1::ProcessConfigure
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  pointer pcVar1;
  cmGlobalGenerator *gg;
  cmState *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  cmFileMonitor *pcVar7;
  Value *pVVar8;
  string *psVar9;
  undefined8 uVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_iterator cVar11;
  Value passedArgs;
  string sourceDir;
  string buildDir;
  string errorMessage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toWatchList;
  _Any_data local_1d8;
  undefined1 local_1c8 [32];
  _Alloc_hider local_1a8;
  ValueHolder local_1a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 local_118 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined8 local_e8;
  long *local_e0;
  size_t local_d8;
  long local_d0 [2];
  cmServerResponse local_c0;
  
  local_1c8._24_8_ = request;
  if (this->m_State == STATE_INACTIVE) {
    local_1a0[0].string_ = (char *)&local_190;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"This instance is inactive.","");
    cmServerRequest::ReportError
              (__return_storage_ptr__,(cmServerRequest *)local_1c8._24_8_,(string *)local_1a0);
    uVar10 = local_1a0[0];
    if (local_1a0[0] == &local_190) {
      return __return_storage_ptr__;
    }
    goto LAB_0014b527;
  }
  pcVar7 = cmServer::FileMonitor((this->super_cmServerProtocol).m_Server);
  cmFileMonitor::StopMonitoring(pcVar7);
  local_138._M_allocated_capacity = (size_type)&local_128;
  local_138._8_8_ = 0;
  local_128._M_local_buf[0] = '\0';
  local_1a8._M_p =
       (pointer)(this->super_cmServerProtocol).m_CMakeInstance._M_t.
                super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  GeneratorInformation::SetupGenerator
            (&this->GeneratorInfo,(cmake *)local_1a8._M_p,(string *)&local_138);
  if (local_138._8_8_ == 0) {
    local_1a0[0].string_ = (char *)&local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"unused","");
    __l._M_len = 1;
    __l._M_array = (iterator)local_1a0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_110,__l,(allocator_type *)local_1d8._M_pod_data);
    if (local_1a0[0] != &local_190) {
      operator_delete(local_1a0[0].string_,local_190._M_allocated_capacity + 1);
    }
    pVVar8 = Json::Value::operator[]
                       ((Value *)(local_1c8._24_8_ + 0x40),&kCACHE_ARGUMENTS_KEY_abi_cxx11_);
    Json::Value::Value((Value *)local_1a0,pVVar8);
    bVar3 = Json::Value::isNull((Value *)local_1a0);
    if (!bVar3) {
      bVar3 = Json::Value::isString((Value *)local_1a0);
      if (bVar3) {
        Json::Value::asString_abi_cxx11_((string *)&local_1d8,(Value *)local_1a0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8);
        if ((cmServerProtocol1 *)local_1d8._M_unused._0_8_ != (cmServerProtocol1 *)local_1c8) {
LAB_0014affb:
          operator_delete(local_1d8._M_unused._M_object,(ulong)(local_1c8._0_8_ + 1));
        }
      }
      else {
        bVar3 = Json::Value::isArray((Value *)local_1a0);
        if (bVar3) {
          cVar11 = Json::Value::begin((Value *)local_1a0);
          local_178._M_allocated_capacity =
               (size_type)cVar11.super_ValueIteratorBase.current_._M_node;
          local_178._M_local_buf[8] = cVar11.super_ValueIteratorBase.isNull_;
          local_118 = (undefined1  [8])__return_storage_ptr__;
          cVar11 = Json::Value::end((Value *)local_1a0);
          local_158._M_allocated_capacity =
               (size_type)cVar11.super_ValueIteratorBase.current_._M_node;
          local_158._M_local_buf[8] = cVar11.super_ValueIteratorBase.isNull_;
          bVar3 = false;
          while (bVar4 = Json::ValueIteratorBase::isEqual
                                   ((ValueIteratorBase *)&local_178,(SelfType *)&local_158), !bVar4)
          {
            pVVar8 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&local_178);
            bVar5 = Json::Value::isString(pVVar8);
            bVar4 = true;
            if (bVar5) {
              Json::Value::asString_abi_cxx11_((string *)&local_1d8,pVVar8);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1d8);
              bVar4 = bVar3;
              if ((cmServerProtocol1 *)local_1d8._M_unused._0_8_ != (cmServerProtocol1 *)local_1c8)
              {
                operator_delete(local_1d8._M_unused._M_object,(ulong)(local_1c8._0_8_ + 1));
              }
            }
            bVar3 = bVar4;
            if (!bVar5) break;
            Json::ValueIteratorBase::increment((ValueIteratorBase *)&local_178);
          }
          __return_storage_ptr__ = (cmServerResponse *)local_118;
          if (!bVar3) goto LAB_0014b008;
        }
        local_1d8._M_unused._M_object = (cmServerProtocol1 *)local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,
                   "cacheArguments must be unset, a string or an array of strings.","");
        cmServerRequest::ReportError
                  (&local_c0,(cmServerRequest *)local_1c8._24_8_,(string *)&local_1d8);
        Json::Value::~Value(&local_c0.m_Data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.m_ErrorMessage._M_dataplus._M_p != &local_c0.m_ErrorMessage.field_2) {
          operator_delete(local_c0.m_ErrorMessage._M_dataplus._M_p,
                          local_c0.m_ErrorMessage.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.Cookie._M_dataplus._M_p != &local_c0.Cookie.field_2) {
          operator_delete(local_c0.Cookie._M_dataplus._M_p,
                          local_c0.Cookie.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.Type._M_dataplus._M_p != &local_c0.Type.field_2) {
          operator_delete(local_c0.Type._M_dataplus._M_p,
                          local_c0.Type.field_2._M_allocated_capacity + 1);
        }
        if ((cmServerProtocol1 *)local_1d8._M_unused._0_8_ != (cmServerProtocol1 *)local_1c8)
        goto LAB_0014affb;
      }
    }
LAB_0014b008:
    psVar9 = cmake::GetHomeDirectory_abi_cxx11_((cmake *)local_1a8._M_p);
    local_178._M_allocated_capacity = (size_type)&local_168;
    pcVar1 = (psVar9->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,pcVar1,pcVar1 + psVar9->_M_string_length);
    psVar9 = cmake::GetHomeOutputDirectory_abi_cxx11_((cmake *)local_1a8._M_p);
    local_158._M_allocated_capacity = (size_type)&local_148;
    pcVar1 = (psVar9->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pcVar1,pcVar1 + psVar9->_M_string_length);
    if (CONCAT71(local_158._9_7_,local_158._M_local_buf[8]) == 0) {
      local_1d8._M_unused._M_object = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,"No build directory set via Handshake.","");
      cmServerRequest::ReportError
                (__return_storage_ptr__,(cmServerRequest *)local_1c8._24_8_,(string *)&local_1d8);
LAB_0014b4a1:
      if ((cmServerProtocol1 *)local_1d8._M_unused._0_8_ != (cmServerProtocol1 *)local_1c8) {
        operator_delete(local_1d8._M_unused._M_object,(ulong)(local_1c8._0_8_ + 1));
      }
    }
    else {
      gg = *(cmGlobalGenerator **)(local_1a8._M_p + 0x30);
      bVar3 = cmake::LoadCache((cmake *)local_1a8._M_p,(string *)&local_158);
      if (!bVar3) {
        if (CONCAT71(local_178._9_7_,local_178._M_local_buf[8]) == 0) {
          local_1d8._M_unused._M_object = local_1c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d8,
                     "No sourceDirectory set via setGlobalSettings and no cache found in buildDirectory."
                     ,"");
          cmServerRequest::ReportError
                    (__return_storage_ptr__,(cmServerRequest *)local_1c8._24_8_,(string *)&local_1d8
                    );
        }
        else {
LAB_0014b2cd:
          cmSystemTools::s_FatalErrorOccured = false;
          cmSystemTools::s_ErrorOccured = false;
          iVar6 = cmake::AddCMakePaths((cmake *)local_1a8._M_p);
          if (iVar6 == 1) {
            bVar3 = cmake::SetCacheArgs((cmake *)local_1a8._M_p,&local_110);
            if (bVar3) {
              iVar6 = cmake::Configure((cmake *)local_1a8._M_p);
              if (-1 < iVar6) {
                local_f8._M_allocated_capacity = 0;
                local_f8._8_8_ = 0;
                local_e8 = 0;
                local_1d8._8_8_ = 0;
                local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffffffffff00;
                local_1d8._M_unused._M_object = local_1c8;
                cmGetCMakeInputs(gg,(string *)&local_1d8,(string *)&local_158,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)0x0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&local_f8,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)0x0);
                if ((undefined1 *)local_1d8._M_unused._0_8_ != local_1c8) {
                  operator_delete(local_1d8._M_unused._M_object,local_1c8._0_8_ + 1);
                }
                pcVar7 = cmServer::FileMonitor((this->super_cmServerProtocol).m_Server);
                local_1d8._8_8_ = 0;
                local_1c8._8_8_ =
                     std::
                     _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:612:31)>
                     ::_M_invoke;
                local_1c8._0_8_ =
                     std::
                     _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:612:31)>
                     ::_M_manager;
                local_1d8._M_unused._M_object = this;
                cmFileMonitor::MonitorPaths
                          (pcVar7,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_f8,(Callback *)&local_1d8);
                if ((_func_int **)local_1c8._0_8_ != (_func_int **)0x0) {
                  (*(code *)local_1c8._0_8_)(&local_1d8,&local_1d8,3);
                }
                this->m_State = STATE_CONFIGURED;
                this->m_isDirty = false;
                Json::Value::Value((Value *)&local_1d8,nullValue);
                cmServerRequest::Reply
                          (__return_storage_ptr__,(cmServerRequest *)local_1c8._24_8_,
                           (Value *)&local_1d8);
                Json::Value::~Value((Value *)&local_1d8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_f8);
                goto LAB_0014b4b7;
              }
              local_1d8._M_unused._M_object = local_1c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,"Configuration failed.","");
              cmServerRequest::ReportError
                        (__return_storage_ptr__,(cmServerRequest *)local_1c8._24_8_,
                         (string *)&local_1d8);
            }
            else {
              local_1d8._M_unused._M_object = local_1c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1d8,"cacheArguments could not be set.","");
              cmServerRequest::ReportError
                        (__return_storage_ptr__,(cmServerRequest *)local_1c8._24_8_,
                         (string *)&local_1d8);
            }
          }
          else {
            local_1d8._M_unused._M_object = local_1c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d8,"Failed to set CMake paths.","");
            cmServerRequest::ReportError
                      (__return_storage_ptr__,(cmServerRequest *)local_1c8._24_8_,
                       (string *)&local_1d8);
          }
        }
        goto LAB_0014b4a1;
      }
      pcVar2 = *(cmState **)(local_1a8._M_p + 0x318);
      local_1d8._M_unused._M_object = (cmServerProtocol1 *)local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,"CMAKE_HOME_DIRECTORY","");
      psVar9 = cmState::GetInitializedCacheValue(pcVar2,(string *)&local_1d8);
      if ((cmServerProtocol1 *)local_1d8._M_unused._0_8_ != (cmServerProtocol1 *)local_1c8) {
        operator_delete(local_1d8._M_unused._M_object,(ulong)(local_1c8._0_8_ + 1));
      }
      if (psVar9 == (string *)0x0) {
        local_1d8._M_unused._M_object = (cmServerProtocol1 *)local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,"No CMAKE_HOME_DIRECTORY found in cache.","");
        cmServerRequest::ReportError
                  (__return_storage_ptr__,(cmServerRequest *)local_1c8._24_8_,(string *)&local_1d8);
      }
      else {
        if (CONCAT71(local_178._9_7_,local_178._M_local_buf[8]) == 0) {
          std::__cxx11::string::_M_assign((string *)local_178._M_local_buf);
          cmake::SetHomeDirectory((cmake *)local_1a8._M_p,(string *)&local_178);
        }
        pcVar2 = *(cmState **)(local_1a8._M_p + 0x318);
        local_1d8._M_unused._M_object = (cmServerProtocol1 *)local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"CMAKE_GENERATOR","");
        psVar9 = cmState::GetInitializedCacheValue(pcVar2,(string *)&local_1d8);
        if ((cmServerProtocol1 *)local_1d8._M_unused._0_8_ != (cmServerProtocol1 *)local_1c8) {
          operator_delete(local_1d8._M_unused._M_object,(ulong)(local_1c8._0_8_ + 1));
        }
        if (psVar9 == (string *)0x0) goto LAB_0014b2cd;
        if (gg == (cmGlobalGenerator *)0x0) {
LAB_0014b255:
          bVar3 = false;
        }
        else {
          (*gg->_vptr_cmGlobalGenerator[3])(&local_e0,gg);
          bVar3 = true;
          if (local_d8 == psVar9->_M_string_length) {
            if (local_d8 == 0) goto LAB_0014b255;
            iVar6 = bcmp(local_e0,(psVar9->_M_dataplus)._M_p,local_d8);
            bVar3 = iVar6 != 0;
          }
        }
        if ((gg != (cmGlobalGenerator *)0x0) && (local_e0 != local_d0)) {
          operator_delete(local_e0,local_d0[0] + 1);
        }
        if (!bVar3) goto LAB_0014b2cd;
        local_1d8._M_unused._M_object = (cmServerProtocol1 *)local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,
                   "Configured generator does not match with CMAKE_GENERATOR found in cache.","");
        cmServerRequest::ReportError
                  (__return_storage_ptr__,(cmServerRequest *)local_1c8._24_8_,(string *)&local_1d8);
      }
      if ((cmServerProtocol1 *)local_1d8._M_unused._0_8_ != (cmServerProtocol1 *)local_1c8) {
        operator_delete(local_1d8._M_unused._M_object,(ulong)(local_1c8._0_8_ + 1));
      }
    }
LAB_0014b4b7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_allocated_capacity != &local_148) {
      operator_delete((void *)local_158._M_allocated_capacity,
                      (ulong)(local_148._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_allocated_capacity != &local_168) {
      operator_delete((void *)local_178._M_allocated_capacity,
                      (ulong)(local_168._M_allocated_capacity + 1));
    }
    Json::Value::~Value((Value *)local_1a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_110);
  }
  else {
    cmServerRequest::ReportError
              (__return_storage_ptr__,(cmServerRequest *)local_1c8._24_8_,(string *)&local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_allocated_capacity == &local_128) {
    return __return_storage_ptr__;
  }
  local_190._M_allocated_capacity =
       CONCAT71(local_128._M_allocated_capacity._1_7_,local_128._M_local_buf[0]);
  uVar10 = local_138._M_allocated_capacity;
LAB_0014b527:
  operator_delete((void *)uVar10,local_190._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessConfigure(
  const cmServerRequest& request)
{
  if (this->m_State == STATE_INACTIVE) {
    return request.ReportError("This instance is inactive.");
  }

  FileMonitor()->StopMonitoring();

  std::string errorMessage;
  cmake* cm = this->CMakeInstance();
  this->GeneratorInfo.SetupGenerator(cm, &errorMessage);
  if (!errorMessage.empty()) {
    return request.ReportError(errorMessage);
  }

  // Make sure the types of cacheArguments matches (if given):
  std::vector<std::string> cacheArgs = { "unused" };
  bool cacheArgumentsError = false;
  const Json::Value passedArgs = request.Data[kCACHE_ARGUMENTS_KEY];
  if (!passedArgs.isNull()) {
    if (passedArgs.isString()) {
      cacheArgs.push_back(passedArgs.asString());
    } else if (passedArgs.isArray()) {
      for (auto const& arg : passedArgs) {
        if (!arg.isString()) {
          cacheArgumentsError = true;
          break;
        }
        cacheArgs.push_back(arg.asString());
      }
    } else {
      cacheArgumentsError = true;
    }
  }
  if (cacheArgumentsError) {
    request.ReportError(
      "cacheArguments must be unset, a string or an array of strings.");
  }

  std::string sourceDir = cm->GetHomeDirectory();
  const std::string buildDir = cm->GetHomeOutputDirectory();

  cmGlobalGenerator* gg = cm->GetGlobalGenerator();

  if (buildDir.empty()) {
    return request.ReportError("No build directory set via Handshake.");
  }

  if (cm->LoadCache(buildDir)) {
    // build directory has been set up before
    const std::string* cachedSourceDir =
      cm->GetState()->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    if (!cachedSourceDir) {
      return request.ReportError("No CMAKE_HOME_DIRECTORY found in cache.");
    }
    if (sourceDir.empty()) {
      sourceDir = *cachedSourceDir;
      cm->SetHomeDirectory(sourceDir);
    }

    const std::string* cachedGenerator =
      cm->GetState()->GetInitializedCacheValue("CMAKE_GENERATOR");
    if (cachedGenerator) {
      if (gg && gg->GetName() != *cachedGenerator) {
        return request.ReportError("Configured generator does not match with "
                                   "CMAKE_GENERATOR found in cache.");
      }
    }
  } else {
    // build directory has not been set up before
    if (sourceDir.empty()) {
      return request.ReportError("No sourceDirectory set via "
                                 "setGlobalSettings and no cache found in "
                                 "buildDirectory.");
    }
  }

  cmSystemTools::ResetErrorOccuredFlag(); // Reset error state

  if (cm->AddCMakePaths() != 1) {
    return request.ReportError("Failed to set CMake paths.");
  }

  if (!cm->SetCacheArgs(cacheArgs)) {
    return request.ReportError("cacheArguments could not be set.");
  }

  int ret = cm->Configure();
  if (ret < 0) {
    return request.ReportError("Configuration failed.");
  }

  std::vector<std::string> toWatchList;
  cmGetCMakeInputs(gg, std::string(), buildDir, nullptr, &toWatchList,
                   nullptr);

  FileMonitor()->MonitorPaths(toWatchList,
                              [this](const std::string& p, int e, int s) {
                                this->HandleCMakeFileChanges(p, e, s);
                              });

  m_State = STATE_CONFIGURED;
  m_isDirty = false;
  return request.Reply(Json::Value());
}